

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_1::PosixEnv::CreateDir(PosixEnv *this,string *name)

{
  int iVar1;
  char *in_RAX;
  _func_int **pp_Var2;
  undefined8 *in_RDX;
  _Alloc_hider local_18;
  
  (this->super_Env)._vptr_Env = (_func_int **)0x0;
  local_18._M_p = in_RAX;
  iVar1 = mkdir((char *)*in_RDX,0x1ed);
  if (iVar1 != 0) {
    __errno_location();
    IOError((string *)&stack0xffffffffffffffe8,(int)*in_RDX);
    if (local_18._M_p != (char *)0x0) {
      pp_Var2 = (_func_int **)Status::CopyState(local_18._M_p);
      (this->super_Env)._vptr_Env = pp_Var2;
      if (local_18._M_p != (char *)0x0) {
        operator_delete__(local_18._M_p);
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status CreateDir(const std::string &name) {
                Status result;
                if (mkdir(name.c_str(), 0755) != 0) {
                    result = IOError(name, errno);
                }
                return result;
            }